

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timedependent.cxx
# Opt level: O2

void __thiscall
Time::runNested(Time *this,unsigned_long_long events,StochasticEventGenerator *eventSource,
               unsigned_long_long maxSteps,unsigned_long_long runs,DataCollector *runHelper,
               ostream *log)

{
  unsigned_long_long r;
  unsigned_long_long uVar1;
  vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> runNumbers;
  unsigned_long_long local_38;
  
  runNumbers.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  runNumbers.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  runNumbers.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38 = 0;
  std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::
  emplace_back<unsigned_long_long>(&runNumbers,&local_38);
  for (uVar1 = 0; runs != uVar1; uVar1 = uVar1 + 1) {
    *runNumbers.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
     super__Vector_impl_data._M_start = uVar1;
    if (runHelper != (DataCollector *)0x0) {
      (*(code *)**(undefined8 **)runHelper)(runHelper,&runNumbers);
    }
    run(this,events,eventSource,maxSteps,log,true);
    if (runHelper != (DataCollector *)0x0) {
      (**(code **)(*(long *)runHelper + 8))(runHelper,&runNumbers);
    }
  }
  std::_Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>::~_Vector_base
            (&runNumbers.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>
            );
  return;
}

Assistant:

void Time::runNested(unsigned long long events, StochasticEventGenerator *eventSource, unsigned long long maxSteps, unsigned long long runs, DataCollector *runHelper, ostream &log )
{
	vector<unsigned long long> runNumbers;
	runNumbers.push_back(0);
	for (unsigned long long r=0; r<runs; ++r) {
		runNumbers[0] = r;
		if (runHelper)
			runHelper->beforeRun(runNumbers);
		run(events, eventSource, maxSteps, log);
		if (runHelper)
			runHelper->afterRun(runNumbers);
	}
}